

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          unsigned_long params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          unsigned_long params_5)

{
  pointer *ppEVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3_00;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  size_type in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppEVar1 = &local_70.
             super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar2 = (msg->_M_dataplus)._M_p;
  local_70.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + msg->_M_string_length);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + params->_M_string_length);
  _Var4._M_p = &stack0xffffffffffffff48;
  pcVar2 = (params_1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff38,pcVar2,pcVar2 + params_1->_M_string_length);
  uVar3 = 0x1125f43;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)params_3,*(long *)(params_3 + 8) + *(long *)params_3);
  params_3_00._M_string_length = uVar3;
  params_3_00._M_dataplus._M_p = params_4._M_dataplus._M_p;
  params_3_00.field_2._M_allocated_capacity = (size_type)_Var4._M_p;
  params_3_00.field_2._8_8_ = in_stack_ffffffffffffff40;
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
            (__return_storage_ptr__,this,(string *)&values,&local_70,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff38,params_2,(unsigned_long)local_50,params_3_00,
             in_stack_ffffffffffffff48);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (_Var4._M_p != &stack0xffffffffffffff48) {
    operator_delete(_Var4._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_70.
      super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
    operator_delete(local_70.
                    super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(&values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}